

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nelder_mead.cpp
# Opt level: O1

bool __thiscall nelder_mead::run_iteration(nelder_mead *this)

{
  int *piVar1;
  vector<float,_std::allocator<float>_> *__x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar2;
  float fVar3;
  vector<float,_std::allocator<float>_> pe;
  vector<float,_std::allocator<float>_> center_of_mass;
  vector<float,_std::allocator<float>_> pr;
  vector<float,_std::allocator<float>_> local_b8;
  vector<float,_std::allocator<float>_> local_a0;
  vector<float,_std::allocator<float>_> local_88;
  float local_6c;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_50;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  find_min_max_error(this);
  fVar3 = ABS(ABS(this->_min_error) - ABS(this->_max_error));
  fVar3 = fVar3 + fVar3;
  fVar2 = (ABS(this->_max_error) + ABS(this->_min_error)) * this->_iteration_epsilon;
  local_28 = ZEXT416((uint)fVar2);
  local_38 = ZEXT416((uint)fVar3);
  if (fVar3 < fVar2) goto LAB_0017cb77;
  get_center_of_mass(&local_68,this);
  vector_utils::sub(&local_a0,&local_68,
                    (this->_simplex).
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->_max_index);
  vector_utils::mul(&local_b8,&local_a0,1.0);
  vector_utils::add(&local_50,&local_68,&local_b8);
  if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*this->_estimator->_vptr_error_estimator[2])(this->_estimator,&local_50);
  fVar2 = this->_min_error;
  if ((extraout_XMM0_Da < fVar2) || (this->_almost_max_error <= extraout_XMM0_Da)) {
    if (fVar2 <= extraout_XMM0_Da) {
      if ((fVar2 <= extraout_XMM0_Da) && (extraout_XMM0_Da <= this->_max_error)) {
        piVar1 = &this->_max_index;
        goto LAB_0017ca63;
      }
      vector_utils::sub(&local_88,
                        (this->_simplex).
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + this->_max_index,&local_68);
      vector_utils::mul(&local_a0,&local_88,0.5);
      vector_utils::add(&local_b8,&local_68,&local_a0);
      if (local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      (*this->_estimator->_vptr_error_estimator[2])(this->_estimator,&local_b8);
      if (this->_max_error <= extraout_XMM0_Da_01) {
        reduce_simplex(this,this->_min_index);
      }
      else {
        std::vector<float,_std::allocator<float>_>::operator=
                  ((this->_simplex).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->_max_index,&local_b8);
      }
    }
    else {
      local_6c = extraout_XMM0_Da;
      vector_utils::sub(&local_88,&local_50,&local_68);
      vector_utils::mul(&local_a0,&local_88,2.0);
      vector_utils::add(&local_b8,&local_68,&local_a0);
      if (local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      (*this->_estimator->_vptr_error_estimator[2])(this->_estimator,&local_b8);
      __x = &local_50;
      if (extraout_XMM0_Da_00 < local_6c) {
        __x = &local_b8;
      }
      std::vector<float,_std::allocator<float>_>::operator=
                ((this->_simplex).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + this->_max_index,__x);
    }
    if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    piVar1 = &this->_almost_max_index;
LAB_0017ca63:
    std::vector<float,_std::allocator<float>_>::operator=
              ((this->_simplex).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *piVar1,&local_50);
  }
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0017cb77:
  return (float)local_28._0_4_ <= (float)local_38._0_4_;
}

Assistant:

bool nelder_mead::run_iteration()
{
  find_min_max_error();

  /*
  if (get_simplex_norm() < _iteration_epsilon)
  {
    return false;
  }
  */

  // stop if difference between maximum and minimum value is very low
  // read the source: Numerical Recipes in C++ (3rd Ed.)
  float a = fabsf(_min_error);
  float b = fabsf(_max_error);

  if (2.0f * fabsf(a - b) < (a + b) * _iteration_epsilon)
  {
    return false;
  }

  auto center_of_mass = get_center_of_mass();

  auto pr = vector_utils::add(center_of_mass, vector_utils::mul(
    vector_utils::sub(center_of_mass, _simplex[_max_index]),
    _reflection_coeff
  ));

  auto pr_value = _estimator->estimate_error(pr);

  // this almost maximum error comparison comes from Wikipedia article
  // refer: 'One possible variation of the NM algorithm' section
  if (pr_value >= _min_error && pr_value < _almost_max_error)
  {
    _simplex[_almost_max_index] = pr;
    return true;
  }
  else if (pr_value < _min_error)
  {
    auto pe = vector_utils::add(center_of_mass, vector_utils::mul(
      vector_utils::sub(pr, center_of_mass),
      _expansion_coeff
    ));

    auto pe_value = _estimator->estimate_error(pe);

    if (pe_value < pr_value) // expansion
    {
      _simplex[_max_index] = pe;
    }
    else // reflection
    {
      _simplex[_max_index] = pr;
    }
  }
  else
  {
    if (_min_error <= pr_value && pr_value <= _max_error) // reflection
    {
      _simplex[_max_index] = pr;
    }
    else
    {
      auto pc = vector_utils::add(center_of_mass, vector_utils::mul(
        vector_utils::sub(_simplex[_max_index], center_of_mass),
        _contraction_coeff
      ));

      auto pc_value = _estimator->estimate_error(pc);

      if (pc_value >= _max_error)
      {
        reduce_simplex(_min_index);
      }
      else // contraction
      {
        _simplex[_max_index] = pc;
      }
    }
  }

  return true;
}